

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

LoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopStatementSyntax,slang::syntax::LoopStatementSyntax_const&>
          (BumpAllocator *this,LoopStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  ExpressionSyntax *pEVar5;
  Info *pIVar6;
  StatementSyntax *pSVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  LoopStatementSyntax *pLVar20;
  
  pLVar20 = (LoopStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LoopStatementSyntax *)this->endPtr < pLVar20 + 1) {
    pLVar20 = (LoopStatementSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pLVar20 + 1);
  }
  (pLVar20->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar8 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pLVar20->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pLVar20->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar8;
  (pLVar20->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pLVar20->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pLVar20->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar8 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pLVar20->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pLVar20->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar8;
  (pLVar20->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pLVar20->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00622e60;
  (pLVar20->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pLVar20->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pLVar20->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pLVar20->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00623138;
  uVar9 = (args->repeatOrWhile).field_0x2;
  NVar10.raw = (args->repeatOrWhile).numFlags.raw;
  uVar11 = (args->repeatOrWhile).rawLen;
  pIVar3 = (args->repeatOrWhile).info;
  TVar12 = (args->openParen).kind;
  uVar13 = (args->openParen).field_0x2;
  NVar14.raw = (args->openParen).numFlags.raw;
  uVar15 = (args->openParen).rawLen;
  pIVar4 = (args->openParen).info;
  pEVar5 = (args->expr).ptr;
  TVar16 = (args->closeParen).kind;
  uVar17 = (args->closeParen).field_0x2;
  NVar18.raw = (args->closeParen).numFlags.raw;
  uVar19 = (args->closeParen).rawLen;
  pIVar6 = (args->closeParen).info;
  pSVar7 = (args->statement).ptr;
  (pLVar20->repeatOrWhile).kind = (args->repeatOrWhile).kind;
  (pLVar20->repeatOrWhile).field_0x2 = uVar9;
  (pLVar20->repeatOrWhile).numFlags = (NumericTokenFlags)NVar10.raw;
  (pLVar20->repeatOrWhile).rawLen = uVar11;
  (pLVar20->repeatOrWhile).info = pIVar3;
  (pLVar20->openParen).kind = TVar12;
  (pLVar20->openParen).field_0x2 = uVar13;
  (pLVar20->openParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pLVar20->openParen).rawLen = uVar15;
  (pLVar20->openParen).info = pIVar4;
  (pLVar20->expr).ptr = pEVar5;
  (pLVar20->closeParen).kind = TVar16;
  (pLVar20->closeParen).field_0x2 = uVar17;
  (pLVar20->closeParen).numFlags = (NumericTokenFlags)NVar18.raw;
  (pLVar20->closeParen).rawLen = uVar19;
  (pLVar20->closeParen).info = pIVar6;
  (pLVar20->statement).ptr = pSVar7;
  return pLVar20;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }